

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequencesSplitLitBuffer
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined8 uVar6;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  size_t sVar7;
  U32 i;
  BIT_DStream_status BVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  size_t *psVar12;
  BYTE *pBVar13;
  uint uVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  int iVar18;
  size_t sVar19;
  size_t sVar20;
  ulong uVar21;
  size_t sVar22;
  BYTE *pBVar23;
  BYTE *oend;
  ulong length;
  BYTE *__dest;
  ulong __n;
  BYTE *local_130;
  BIT_DStream_t local_128;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  size_t local_d0 [4];
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  ulong local_90;
  size_t sStack_88;
  size_t local_80;
  int local_74;
  ZSTD_DCtx *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  ulong local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  local_a8 = (BYTE *)(maxDstSize + (long)dst);
  pBVar17 = dctx->litPtr;
  local_98 = dctx->litBufferEnd;
  local_a0 = pBVar17;
  if (nbSeq == 0) {
    local_74 = 0;
    pBVar17 = (BYTE *)dst;
LAB_006f68cc:
    pBVar16 = local_a0;
    if (dctx->litBufferLocation == ZSTD_split) {
      uVar21 = (long)local_98 - (long)local_a0;
      if ((ulong)((long)local_a8 - (long)dst) < uVar21) {
        return 0xffffffffffffffba;
      }
      if ((BYTE *)dst == (BYTE *)0x0) {
        dst = (BYTE *)0x0;
      }
      else {
        memmove(dst,local_a0,uVar21);
        dst = (void *)((long)dst + uVar21);
      }
      pBVar16 = dctx->litExtraBuffer;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      local_98 = dctx->litExtraBuffer + 0x10000;
    }
    uVar21 = (long)local_98 - (long)pBVar16;
    sVar20 = 0xffffffffffffffba;
    if (uVar21 <= (ulong)((long)local_a8 - (long)dst)) {
      if ((BYTE *)dst == (BYTE *)0x0) {
        pBVar16 = (BYTE *)0x0;
      }
      else {
        memcpy(dst,pBVar16,uVar21);
        pBVar16 = (BYTE *)((long)dst + uVar21);
      }
      sVar20 = (long)pBVar16 - (long)pBVar17;
    }
  }
  else {
    pBVar16 = (BYTE *)dctx->prefixStart;
    local_58 = (BYTE *)dctx->virtualStart;
    local_60 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar9 = -0xc;
    do {
      *(ulong *)((long)local_d0 + lVar9 * 2 + 0x18) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0);
    if (seqSize != 0) {
      local_128.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_128.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_128.bitContainer =
               local_128.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_128.bitContainer =
               local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_128.bitContainer =
               local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_128.bitContainer =
               local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_128.bitContainer =
               local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_128.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_128.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 != 0) {
          uVar14 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          local_128.bitsConsumed = (uVar14 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_128.ptr = (char *)seqStart;
LAB_006f69af:
          local_128.start = (char *)seqStart;
          local_74 = nbSeq;
          ZSTD_initFseState(&local_100,&local_128,dctx->LLTptr);
          ZSTD_initFseState(&local_f0,&local_128,dctx->OFTptr);
          local_70 = dctx;
          ZSTD_initFseState(&local_e0,&local_128,dctx->MLTptr);
          sVar20 = local_d0[1];
          if (dst == (void *)0x0) {
            __assert_fail("dst != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x565,
                          "size_t ZSTD_decompressSequences_bodySplitLitBuffer(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                         );
          }
          bVar1 = local_100.table[local_100.state].nbAdditionalBits;
          if (0x10 < bVar1) {
LAB_006f7f71:
            __assert_fail("llBits <= MaxLLBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x4c8,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)")
            ;
          }
          bVar11 = local_e0.table[local_e0.state].nbAdditionalBits;
          if (0x10 < bVar11) {
LAB_006f7f90:
            __assert_fail("mlBits <= MaxMLBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x4c9,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)")
            ;
          }
          local_b0 = pBVar16;
          local_40 = (BYTE *)dst;
          bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
          if (0x1f < bVar2) {
LAB_006f7faf:
            __assert_fail("ofBits <= MaxOff",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x4ca,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)")
            ;
          }
          __n = (ulong)local_e0.table[local_e0.state].baseValue;
          uVar14 = local_100.table[local_100.state].baseValue;
          uVar21 = (ulong)uVar14;
          local_68 = (BYTE *)(ulong)local_100.table[local_100.state].nextState;
          bVar3 = local_100.table[local_100.state].nbBits;
          bVar4 = local_e0.table[local_e0.state].nbBits;
          bVar5 = local_f0.table[local_f0.state].nbBits;
          local_50 = (ulong)local_f0.table[local_f0.state].nextState;
          local_48 = (ulong)local_e0.table[local_e0.state].nextState;
          bVar10 = (byte)local_128.bitsConsumed;
          if (bVar2 < 2) {
            if (bVar2 != 0) {
              local_128.bitsConsumed = local_128.bitsConsumed + 1;
              lVar9 = (ulong)(local_f0.table[local_f0.state].baseValue + (uint)(uVar14 == 0)) -
                      ((long)(local_128.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
              if (lVar9 == 3) {
                sVar22 = (local_d0[0] - 1) + (ulong)(local_d0[0] == 1);
LAB_006f8196:
                local_d0[2] = local_d0[1];
              }
              else {
                sVar22 = local_d0[lVar9] + (ulong)(local_d0[lVar9] == 0);
                if (lVar9 != 1) goto LAB_006f8196;
              }
              local_d0[1] = local_d0[0];
              goto LAB_006f6ada;
            }
            sVar22 = local_d0[uVar14 == 0];
            local_d0[1] = local_d0[uVar14 != 0];
          }
          else {
            local_128.bitsConsumed = local_128.bitsConsumed + bVar2;
            sVar22 = ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f)) +
                     (ulong)local_f0.table[local_f0.state].baseValue;
            local_d0[1] = local_d0[0];
            local_d0[2] = sVar20;
LAB_006f6ada:
            local_d0[1] = local_d0[0];
          }
          local_d0[0] = sVar22;
          if (bVar11 != 0) {
            bVar10 = (byte)local_128.bitsConsumed;
            local_128.bitsConsumed = local_128.bitsConsumed + bVar11;
            __n = __n + ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
          }
          if (0x1e < (byte)(bVar11 + bVar1 + bVar2)) {
            local_d0[3] = sVar22;
            ZSTD_decompressSequencesSplitLitBuffer_cold_1();
            sVar22 = local_d0[3];
          }
          if (bVar1 != 0) {
            bVar11 = (byte)local_128.bitsConsumed;
            local_128.bitsConsumed = local_128.bitsConsumed + bVar1;
            uVar21 = uVar21 + ((local_128.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
          }
          if (0x1f < bVar3) {
LAB_006f7ecb:
            __assert_fail("nbBits < BIT_MASK_SIZE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                          ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
          }
          local_100.state =
               (size_t)(local_68 +
                       (~(-1L << (bVar3 & 0x3f)) &
                       local_128.bitContainer >> (-(char)(bVar3 + local_128.bitsConsumed) & 0x3fU)))
          ;
          if (0x1f < bVar4) goto LAB_006f7ecb;
          iVar18 = bVar3 + local_128.bitsConsumed + (uint)bVar4;
          local_e0.state =
               (~(-1L << (bVar4 & 0x3f)) & local_128.bitContainer >> (-(char)iVar18 & 0x3fU)) +
               local_48;
          if (0x1f < bVar5) goto LAB_006f7ecb;
          local_128.bitsConsumed = iVar18 + (uint)bVar5;
          local_f0.state =
               (~(-1L << (bVar5 & 0x3f)) &
               local_128.bitContainer >> (-(char)local_128.bitsConsumed & 0x3fU)) + local_50;
          pBVar16 = pBVar17 + uVar21;
          pBVar23 = local_70->litBufferEnd;
          if (pBVar23 < pBVar16) {
            local_130 = local_40;
          }
          else {
            local_130 = local_40;
            do {
              pBVar13 = local_b0;
              pBVar23 = pBVar16 + -0x20;
              local_90 = uVar21;
              sStack_88 = __n;
              local_80 = sVar22;
              if (local_a8 <= pBVar23) {
                __assert_fail("oend_w < oend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x432,
                              "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (local_98 < pBVar16) {
LAB_006f7140:
                sequence.matchLength = __n;
                sequence.litLength = uVar21;
                sequence.offset = sVar22;
                sVar20 = ZSTD_execSequenceEndSplitLitBuffer
                                   (local_130,local_a8,pBVar23,sequence,&local_a0,local_98,local_b0,
                                    local_58,local_60);
              }
              else {
                sVar20 = __n + uVar21;
                pBVar15 = local_130 + sVar20;
                if (pBVar23 < pBVar15) goto LAB_006f7140;
                if ((long)uVar21 < 0) {
                  __assert_fail("op <= oLitEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x43f,
                                "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if ((long)sVar20 <= (long)uVar21) {
                  __assert_fail("oLitEnd < oMatchEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x440,
                                "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                __dest = local_130 + uVar21;
                if (pBVar23 < __dest) {
                  __assert_fail("oLitEnd <= oend_w",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x443,
                                "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                uVar6 = *(undefined8 *)(pBVar17 + 8);
                *(undefined8 *)local_130 = *(undefined8 *)pBVar17;
                *(undefined8 *)(local_130 + 8) = uVar6;
                sVar19 = sVar22;
                if (0x10 < uVar21) {
                  if ((BYTE *)0xffffffffffffffe0 <
                      local_130 + 0x10 + (-0x10 - (long)(pBVar17 + 0x10))) goto LAB_006f80b0;
                  uVar6 = *(undefined8 *)(pBVar17 + 0x18);
                  *(undefined8 *)(local_130 + 0x10) = *(undefined8 *)(pBVar17 + 0x10);
                  *(undefined8 *)(local_130 + 0x18) = uVar6;
                  if (0x20 < uVar21) {
                    lVar9 = 0;
                    do {
                      uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x20 + 8);
                      pBVar23 = local_130 + lVar9 + 0x20;
                      *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar17 + lVar9 + 0x20);
                      *(undefined8 *)(pBVar23 + 8) = uVar6;
                      uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x30 + 8);
                      *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar17 + lVar9 + 0x30);
                      *(undefined8 *)(pBVar23 + 0x18) = uVar6;
                      lVar9 = lVar9 + 0x20;
                      sVar19 = local_80;
                    } while (pBVar23 + 0x20 < __dest);
                  }
                }
                local_a0 = pBVar16;
                pBVar17 = __dest + -sVar22;
                if ((ulong)((long)__dest - (long)local_b0) < sVar19) {
                  if ((ulong)((long)__dest - (long)local_58) < sVar19) goto LAB_006f7e93;
                  lVar9 = (long)(__dest + -sVar22) - (long)local_b0;
                  pBVar17 = local_60 + lVar9;
                  local_d0[3] = sVar20;
                  if (local_60 < pBVar17 + __n) {
                    memmove(__dest,pBVar17,-lVar9);
                    __dest = __dest + -lVar9;
                    __n = __n + lVar9;
                    sStack_88 = __n;
                    sVar20 = local_d0[3];
                    pBVar17 = pBVar13;
                    goto LAB_006f6de4;
                  }
                  memmove(__dest,pBVar17,__n);
                  sVar20 = local_d0[3];
                }
                else {
LAB_006f6de4:
                  sStack_88 = __n;
                  if (pBVar15 < __dest) {
                    __assert_fail("op <= oMatchEnd",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                  ,0x463,
                                  "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                 );
                  }
                  if (pBVar17 < local_b0) {
                    __assert_fail("match >= prefixStart",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                  ,0x465,
                                  "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                 );
                  }
                  if (__n == 0) {
                    __assert_fail("sequence.matchLength >= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                  ,0x466,
                                  "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                 );
                  }
                  if (sVar19 < 0x10) {
                    if (__dest < pBVar17) goto LAB_006f8375;
                    if (sVar19 < 8) {
                      iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar19 * 4);
                      *__dest = *pBVar17;
                      __dest[1] = pBVar17[1];
                      __dest[2] = pBVar17[2];
                      __dest[3] = pBVar17[3];
                      pBVar16 = pBVar17 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar19 * 4);
                      pBVar17 = pBVar17 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table +
                                                           sVar19 * 4) - (long)iVar18);
                      *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar16;
                    }
                    else {
                      *(undefined8 *)__dest = *(undefined8 *)pBVar17;
                    }
                    pBVar16 = pBVar17 + 8;
                    pBVar23 = __dest + 8;
                    if ((long)pBVar23 - (long)pBVar16 < 8) goto LAB_006f8394;
                    if (8 < __n) {
                      if (pBVar15 <= pBVar23) {
                        __assert_fail("op < oMatchEnd",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                      ,0x47a,
                                      "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                     );
                      }
                      if ((ulong)((long)pBVar23 - (long)pBVar16) < 0x10) {
                        do {
                          *(undefined8 *)pBVar23 = *(undefined8 *)pBVar16;
                          pBVar23 = pBVar23 + 8;
                          pBVar16 = pBVar16 + 8;
                        } while (pBVar23 < __dest + __n);
                      }
                      else {
                        uVar6 = *(undefined8 *)(pBVar17 + 0x10);
                        *(undefined8 *)pBVar23 = *(undefined8 *)pBVar16;
                        *(undefined8 *)(__dest + 0x10) = uVar6;
                        if (0x18 < (long)__n) {
                          lVar9 = 0;
                          do {
                            uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x18 + 8);
                            pBVar16 = __dest + lVar9 + 0x18;
                            *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar17 + lVar9 + 0x18);
                            *(undefined8 *)(pBVar16 + 8) = uVar6;
                            uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x28 + 8);
                            *(undefined8 *)(pBVar16 + 0x10) =
                                 *(undefined8 *)(pBVar17 + lVar9 + 0x28);
                            *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar16 + 0x20 < __dest + __n);
                        }
                      }
                    }
                  }
                  else {
                    if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar17))
                    goto LAB_006f80b0;
                    uVar6 = *(undefined8 *)(pBVar17 + 8);
                    *(undefined8 *)__dest = *(undefined8 *)pBVar17;
                    *(undefined8 *)(__dest + 8) = uVar6;
                    if (0x10 < (long)__n) {
                      lVar9 = 0x10;
                      do {
                        uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 8);
                        pBVar16 = __dest + lVar9;
                        *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar17 + lVar9);
                        *(undefined8 *)(pBVar16 + 8) = uVar6;
                        uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x10 + 8);
                        *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(pBVar17 + lVar9 + 0x10);
                        *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                        lVar9 = lVar9 + 0x20;
                      } while (pBVar16 + 0x20 < __dest + __n);
                    }
                  }
                }
              }
              if (0xffffffffffffff88 < sVar20) {
                return sVar20;
              }
              dst = local_130 + sVar20;
              local_74 = local_74 + -1;
              if (local_74 == 0) goto LAB_006f7e32;
              if (local_128.bitsConsumed < 0x41) {
                if (local_128.ptr < local_128.limitPtr) {
                  if (local_128.ptr == local_128.start) goto LAB_006f6efb;
                  uVar14 = (int)local_128.ptr - (int)local_128.start;
                  if (local_128.start <=
                      (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                    uVar14 = local_128.bitsConsumed >> 3;
                  }
                  local_128.bitsConsumed = local_128.bitsConsumed + uVar14 * -8;
                }
                else {
                  uVar14 = local_128.bitsConsumed >> 3;
                  local_128.bitsConsumed = local_128.bitsConsumed & 7;
                }
                local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar14);
                local_128.bitContainer = *(size_t *)local_128.ptr;
              }
LAB_006f6efb:
              bVar1 = local_100.table[local_100.state].nbAdditionalBits;
              if (0x10 < bVar1) goto LAB_006f7f71;
              bVar11 = local_e0.table[local_e0.state].nbAdditionalBits;
              if (0x10 < bVar11) goto LAB_006f7f90;
              bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
              if (0x1f < bVar2) goto LAB_006f7faf;
              __n = (ulong)local_e0.table[local_e0.state].baseValue;
              uVar14 = local_100.table[local_100.state].baseValue;
              uVar21 = (ulong)uVar14;
              local_68 = (BYTE *)(ulong)local_100.table[local_100.state].nextState;
              local_48 = (ulong)local_e0.table[local_e0.state].nextState;
              local_50 = (ulong)local_f0.table[local_f0.state].nextState;
              bVar3 = local_100.table[local_100.state].nbBits;
              bVar4 = local_e0.table[local_e0.state].nbBits;
              bVar5 = local_f0.table[local_f0.state].nbBits;
              bVar10 = (byte)local_128.bitsConsumed;
              if (bVar2 < 2) {
                if (bVar2 == 0) {
                  local_d0[0] = local_d0[uVar14 == 0];
                  psVar12 = local_d0 + (uVar14 != 0);
                }
                else {
                  local_128.bitsConsumed = local_128.bitsConsumed + 1;
                  lVar9 = (ulong)(local_f0.table[local_f0.state].baseValue + (uint)(uVar14 == 0)) -
                          ((long)(local_128.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
                  if (lVar9 == 3) {
                    local_d0[0] = (local_d0[0] - 1) + (ulong)(local_d0[0] == 1);
LAB_006f73a3:
                    local_d0[2] = local_d0[1];
                  }
                  else {
                    local_d0[0] = local_d0[lVar9] + (ulong)(local_d0[lVar9] == 0);
                    if (lVar9 != 1) goto LAB_006f73a3;
                  }
                  psVar12 = local_d0;
                }
              }
              else {
                local_128.bitsConsumed = local_128.bitsConsumed + bVar2;
                local_d0[0] = ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f)) +
                              (ulong)local_f0.table[local_f0.state].baseValue;
                local_d0[2] = local_d0[1];
                psVar12 = local_d0;
              }
              local_d0[1] = *psVar12;
              if (bVar11 != 0) {
                bVar10 = (byte)local_128.bitsConsumed;
                local_128.bitsConsumed = local_128.bitsConsumed + bVar11;
                __n = __n + ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
              }
              sVar22 = local_d0[0];
              if ((0x1e < (byte)(bVar11 + bVar1 + bVar2)) && (local_128.bitsConsumed < 0x41)) {
                if (local_128.ptr < local_128.limitPtr) {
                  if (local_128.ptr != local_128.start) {
                    uVar14 = (int)local_128.ptr - (int)local_128.start;
                    if (local_128.start <=
                        (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                      uVar14 = local_128.bitsConsumed >> 3;
                    }
                    local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar14);
                    local_128.bitsConsumed = local_128.bitsConsumed + uVar14 * -8;
                    local_128.bitContainer = *(size_t *)local_128.ptr;
                  }
                }
                else {
                  local_d0[3] = local_d0[0];
                  BIT_reloadDStreamFast(&local_128);
                  sVar22 = local_d0[3];
                }
              }
              if (bVar1 != 0) {
                bVar11 = (byte)local_128.bitsConsumed;
                local_128.bitsConsumed = local_128.bitsConsumed + bVar1;
                uVar21 = uVar21 + ((local_128.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
              }
              if (0x1f < bVar3) goto LAB_006f7ecb;
              local_100.state =
                   (size_t)(local_68 +
                           (~(-1L << (bVar3 & 0x3f)) &
                           local_128.bitContainer >>
                           (-(char)(bVar3 + local_128.bitsConsumed) & 0x3fU)));
              if (0x1f < bVar4) goto LAB_006f7ecb;
              iVar18 = bVar3 + local_128.bitsConsumed + (uint)bVar4;
              local_e0.state =
                   (~(-1L << (bVar4 & 0x3f)) & local_128.bitContainer >> (-(char)iVar18 & 0x3fU)) +
                   local_48;
              if (0x1f < bVar5) goto LAB_006f7ecb;
              local_128.bitsConsumed = iVar18 + (uint)bVar5;
              local_f0.state =
                   (~(-1L << (bVar5 & 0x3f)) &
                   local_128.bitContainer >> (-(char)local_128.bitsConsumed & 0x3fU)) + local_50;
              pBVar16 = local_a0 + uVar21;
              pBVar23 = local_70->litBufferEnd;
              pBVar17 = local_a0;
              local_130 = (BYTE *)dst;
            } while (pBVar16 <= pBVar23);
          }
          pBVar16 = local_b0;
          if (local_74 < 1) goto LAB_006f7e93;
          length = (long)pBVar23 - (long)pBVar17;
          if (length != 0) {
            if ((ulong)((long)local_a8 - (long)local_130) < length) {
              return 0xffffffffffffffba;
            }
            ZSTD_safecopyDstBeforeSrc(local_130,pBVar17,length);
            uVar21 = uVar21 - length;
            local_130 = local_130 + length;
          }
          local_a0 = local_70->litExtraBuffer;
          local_70->litBufferLocation = ZSTD_not_in_dst;
          local_90 = uVar21;
          sStack_88 = __n;
          local_80 = sVar22;
          if (local_130 == (BYTE *)0x0) {
            __assert_fail("op != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3d0,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          local_98 = local_70->litExtraBuffer + 0x10000;
          local_38 = local_a8 + -0x20;
          if ((long)uVar21 < 0x10001) {
            sVar20 = __n + uVar21;
            pBVar17 = local_130 + sVar20;
            if (local_38 < pBVar17) goto LAB_006f7f18;
            if ((long)uVar21 < 0) {
LAB_006f8013:
              __assert_fail("op <= oLitEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x3e3,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if ((long)sVar20 <= (long)uVar21) {
LAB_006f8032:
              __assert_fail("oLitEnd < oMatchEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x3e4,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (local_a8 < pBVar17) {
LAB_006f8051:
              __assert_fail("oMatchEnd <= oend",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x3e5,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            pBVar16 = local_130 + uVar21;
            if (local_38 < pBVar16) {
LAB_006f8070:
              __assert_fail("oLitEnd <= oend_w",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,999,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            pBVar23 = local_70->litExtraBuffer;
            uVar6 = *(undefined8 *)(local_70->litExtraBuffer + 8);
            *(undefined8 *)local_130 = *(undefined8 *)local_a0;
            *(undefined8 *)(local_130 + 8) = uVar6;
            if (0x10 < uVar21) {
              ZSTD_decompressSequencesSplitLitBuffer_cold_2();
            }
            sVar7 = local_80;
            sVar19 = sStack_88;
            pBVar13 = local_b0;
            local_a0 = pBVar23 + uVar21;
            pBVar23 = pBVar16 + -sVar22;
            if ((ulong)((long)pBVar16 - (long)local_b0) < local_80) {
              if ((ulong)((long)pBVar16 - (long)local_58) < local_80) goto LAB_006f7e93;
              lVar9 = (long)(pBVar16 + -sVar22) - (long)local_b0;
              pBVar23 = local_60 + lVar9;
              if (local_60 < pBVar23 + sStack_88) {
                local_68 = pBVar17;
                memmove(pBVar16,pBVar23,-lVar9);
                pBVar16 = pBVar16 + -lVar9;
                sStack_88 = sVar19 + lVar9;
                pBVar17 = local_68;
                pBVar23 = pBVar13;
                goto LAB_006f7580;
              }
              memmove(pBVar16,pBVar23,sStack_88);
            }
            else {
LAB_006f7580:
              if (pBVar17 < pBVar16) {
LAB_006f80cf:
                __assert_fail("op <= oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x408,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (pBVar23 < local_b0) {
LAB_006f80ee:
                __assert_fail("match >= prefixStart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x40a,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (sStack_88 == 0) {
LAB_006f810d:
                __assert_fail("sequence.matchLength >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x40b,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (sVar7 < 0x10) {
                if (pBVar16 < pBVar23) {
LAB_006f8375:
                  __assert_fail("*ip <= *op",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                }
                if (sVar7 < 8) {
                  iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar7 * 4);
                  *pBVar16 = *pBVar23;
                  pBVar16[1] = pBVar23[1];
                  pBVar16[2] = pBVar23[2];
                  pBVar16[3] = pBVar23[3];
                  pBVar13 = pBVar23 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar7 * 4);
                  pBVar23 = pBVar23 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar7 * 4) -
                                      (long)iVar18);
                  *(undefined4 *)(pBVar16 + 4) = *(undefined4 *)pBVar13;
                }
                else {
                  *(undefined8 *)pBVar16 = *(undefined8 *)pBVar23;
                }
                pBVar13 = pBVar23 + 8;
                pBVar15 = pBVar16 + 8;
                if ((long)pBVar15 - (long)pBVar13 < 8) {
LAB_006f8394:
                  __assert_fail("*op - *ip >= 8",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                }
                if (8 < sStack_88) {
                  if (pBVar17 <= pBVar15) {
LAB_006f83b3:
                    __assert_fail("op < oMatchEnd",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                  ,0x41f,
                                  "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                 );
                  }
                  if ((ulong)((long)pBVar15 - (long)pBVar13) < 0x10) {
                    do {
                      *(undefined8 *)pBVar15 = *(undefined8 *)pBVar13;
                      pBVar15 = pBVar15 + 8;
                      pBVar13 = pBVar13 + 8;
                    } while (pBVar15 < pBVar16 + sStack_88);
                  }
                  else {
                    uVar6 = *(undefined8 *)(pBVar23 + 0x10);
                    *(undefined8 *)pBVar15 = *(undefined8 *)pBVar13;
                    *(undefined8 *)(pBVar16 + 0x10) = uVar6;
                    if (0x18 < (long)sStack_88) {
                      lVar9 = 0;
                      do {
                        uVar6 = *(undefined8 *)(pBVar23 + lVar9 + 0x18 + 8);
                        pBVar17 = pBVar16 + lVar9 + 0x18;
                        *(undefined8 *)pBVar17 = *(undefined8 *)(pBVar23 + lVar9 + 0x18);
                        *(undefined8 *)(pBVar17 + 8) = uVar6;
                        uVar6 = *(undefined8 *)(pBVar23 + lVar9 + 0x28 + 8);
                        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x28);
                        *(undefined8 *)(pBVar17 + 0x18) = uVar6;
                        lVar9 = lVar9 + 0x20;
                      } while (pBVar17 + 0x20 < pBVar16 + sStack_88);
                    }
                  }
                }
              }
              else {
                if ((BYTE *)0xffffffffffffffe0 < pBVar16 + (-0x10 - (long)pBVar23)) {
LAB_006f80b0:
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                                ,0xe9,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                uVar6 = *(undefined8 *)(pBVar23 + 8);
                *(undefined8 *)pBVar16 = *(undefined8 *)pBVar23;
                *(undefined8 *)(pBVar16 + 8) = uVar6;
                if (0x10 < (long)sStack_88) {
                  lVar9 = 0x10;
                  do {
                    uVar6 = *(undefined8 *)(pBVar23 + lVar9 + 8);
                    pBVar17 = pBVar16 + lVar9;
                    *(undefined8 *)pBVar17 = *(undefined8 *)(pBVar23 + lVar9);
                    *(undefined8 *)(pBVar17 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar23 + lVar9 + 0x10 + 8);
                    *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x10);
                    *(undefined8 *)(pBVar17 + 0x18) = uVar6;
                    lVar9 = lVar9 + 0x20;
                  } while (pBVar17 + 0x20 < pBVar16 + sStack_88);
                }
              }
            }
          }
          else {
LAB_006f7f18:
            sequence_01.matchLength = __n;
            sequence_01.litLength = uVar21;
            sequence_01.offset = sVar22;
            sVar20 = ZSTD_execSequenceEnd
                               (local_130,local_a8,sequence_01,&local_a0,
                                local_70->litExtraBuffer + 0x10000,pBVar16,local_58,local_60);
          }
          if (0xffffffffffffff88 < sVar20) {
            return sVar20;
          }
          dst = local_130 + sVar20;
          local_74 = local_74 + -1;
          if (local_74 != 0) {
            if (local_128.bitsConsumed < 0x41) {
              if (local_128.ptr < local_128.limitPtr) {
                if (local_128.ptr != local_128.start) {
                  uVar14 = (int)local_128.ptr - (int)local_128.start;
                  if (local_128.start <=
                      (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                    uVar14 = local_128.bitsConsumed >> 3;
                  }
                  local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar14);
                  local_128.bitsConsumed = local_128.bitsConsumed + uVar14 * -8;
                  local_128.bitContainer = *(size_t *)local_128.ptr;
                }
              }
              else {
                BIT_reloadDStreamFast(&local_128);
              }
            }
LAB_006f7758:
            do {
              bVar1 = local_100.table[local_100.state].nbAdditionalBits;
              if (0x10 < bVar1) goto LAB_006f7f71;
              bVar11 = local_e0.table[local_e0.state].nbAdditionalBits;
              if (0x10 < bVar11) goto LAB_006f7f90;
              bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
              if (0x1f < bVar2) goto LAB_006f7faf;
              sVar20 = (size_t)local_e0.table[local_e0.state].baseValue;
              uVar14 = local_100.table[local_100.state].baseValue;
              uVar21 = (ulong)uVar14;
              local_68 = (BYTE *)(ulong)local_100.table[local_100.state].nextState;
              local_48 = (ulong)local_e0.table[local_e0.state].nextState;
              local_50 = (ulong)local_f0.table[local_f0.state].nextState;
              bVar3 = local_100.table[local_100.state].nbBits;
              bVar4 = local_e0.table[local_e0.state].nbBits;
              bVar5 = local_f0.table[local_f0.state].nbBits;
              bVar10 = (byte)local_128.bitsConsumed;
              if (bVar2 < 2) {
                if (bVar2 == 0) {
                  sVar22 = local_d0[uVar14 == 0];
                  psVar12 = local_d0 + (uVar14 != 0);
                }
                else {
                  local_128.bitsConsumed = local_128.bitsConsumed + 1;
                  lVar9 = (ulong)(local_f0.table[local_f0.state].baseValue + (uint)(uVar14 == 0)) -
                          ((long)(local_128.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
                  if (lVar9 == 3) {
                    sVar22 = (local_d0[0] - 1) + (ulong)(local_d0[0] == 1);
                  }
                  else {
                    sVar22 = local_d0[lVar9] + (ulong)(local_d0[lVar9] == 0);
                    psVar12 = local_d0;
                    if (lVar9 == 1) goto LAB_006f7860;
                  }
                  local_d0[2] = local_d0[1];
                  psVar12 = local_d0;
                }
              }
              else {
                local_128.bitsConsumed = local_128.bitsConsumed + bVar2;
                sVar22 = ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f)) +
                         (ulong)local_f0.table[local_f0.state].baseValue;
                local_d0[2] = local_d0[1];
                psVar12 = local_d0;
              }
LAB_006f7860:
              local_d0[1] = *psVar12;
              local_d0[0] = sVar22;
              if (bVar11 != 0) {
                bVar10 = (byte)local_128.bitsConsumed;
                local_128.bitsConsumed = local_128.bitsConsumed + bVar11;
                sVar20 = sVar20 + ((local_128.bitContainer << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
              }
              if ((0x1e < (byte)(bVar11 + bVar1 + bVar2)) && (local_128.bitsConsumed < 0x41)) {
                if (local_128.ptr < local_128.limitPtr) {
                  if (local_128.ptr != local_128.start) {
                    uVar14 = (int)local_128.ptr - (int)local_128.start;
                    if (local_128.start <=
                        (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                      uVar14 = local_128.bitsConsumed >> 3;
                    }
                    local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar14);
                    local_128.bitsConsumed = local_128.bitsConsumed + uVar14 * -8;
                    local_128.bitContainer = *(size_t *)local_128.ptr;
                  }
                }
                else {
                  local_d0[3] = sVar20;
                  BIT_reloadDStreamFast(&local_128);
                  sVar20 = local_d0[3];
                }
              }
              if (bVar1 != 0) {
                bVar11 = (byte)local_128.bitsConsumed;
                local_128.bitsConsumed = local_128.bitsConsumed + bVar1;
                uVar21 = uVar21 + ((local_128.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
              }
              if (0x1f < bVar3) goto LAB_006f7ecb;
              local_100.state =
                   (size_t)(local_68 +
                           (~(-1L << (bVar3 & 0x3f)) &
                           local_128.bitContainer >>
                           (-(char)(bVar3 + local_128.bitsConsumed) & 0x3fU)));
              if (0x1f < bVar4) goto LAB_006f7ecb;
              iVar18 = bVar3 + local_128.bitsConsumed + (uint)bVar4;
              local_e0.state =
                   (~(-1L << (bVar4 & 0x3f)) & local_128.bitContainer >> (-(char)iVar18 & 0x3fU)) +
                   local_48;
              if (0x1f < bVar5) goto LAB_006f7ecb;
              local_128.bitsConsumed = iVar18 + (uint)bVar5;
              local_f0.state =
                   (~(-1L << (bVar5 & 0x3f)) &
                   local_128.bitContainer >> (-(char)local_128.bitsConsumed & 0x3fU)) + local_50;
              local_90 = uVar21;
              sStack_88 = sVar20;
              local_80 = sVar22;
              pBVar17 = local_a0 + uVar21;
              if (local_98 < pBVar17) {
LAB_006f7bbf:
                sequence_00.matchLength = sVar20;
                sequence_00.litLength = uVar21;
                sequence_00.offset = sVar22;
                sVar19 = ZSTD_execSequenceEnd
                                   ((BYTE *)dst,local_a8,sequence_00,&local_a0,local_98,local_b0,
                                    local_58,local_60);
              }
              else {
                sVar19 = sVar20 + uVar21;
                pBVar16 = (BYTE *)((long)dst + sVar19);
                if (local_38 < pBVar16) goto LAB_006f7bbf;
                if ((long)uVar21 < 0) goto LAB_006f8013;
                if ((long)sVar19 <= (long)uVar21) goto LAB_006f8032;
                if (local_a8 < pBVar16) goto LAB_006f8051;
                pBVar23 = (BYTE *)((long)dst + uVar21);
                if (local_38 < pBVar23) goto LAB_006f8070;
                uVar6 = *(undefined8 *)(local_a0 + 8);
                *(undefined8 *)dst = *(undefined8 *)local_a0;
                *(undefined8 *)((long)dst + 8) = uVar6;
                if (0x10 < uVar21) {
                  ZSTD_decompressSequencesSplitLitBuffer_cold_3();
                }
                sVar7 = local_80;
                sVar20 = sStack_88;
                pBVar13 = local_b0;
                local_a0 = pBVar17;
                pBVar17 = pBVar23 + -sVar22;
                if ((ulong)((long)pBVar23 - (long)local_b0) < local_80) {
                  if ((ulong)((long)pBVar23 - (long)local_58) < local_80) goto LAB_006f7e93;
                  lVar9 = (long)(pBVar23 + -sVar22) - (long)local_b0;
                  pBVar17 = local_60 + lVar9;
                  local_d0[3] = sVar19;
                  if (local_60 < pBVar17 + sStack_88) {
                    memmove(pBVar23,pBVar17,-lVar9);
                    pBVar23 = pBVar23 + -lVar9;
                    sStack_88 = sVar20 + lVar9;
                    pBVar17 = pBVar13;
                    sVar19 = local_d0[3];
                    goto LAB_006f7a9b;
                  }
                  memmove(pBVar23,pBVar17,sStack_88);
                  sVar19 = local_d0[3];
                }
                else {
LAB_006f7a9b:
                  if (pBVar16 < pBVar23) goto LAB_006f80cf;
                  if (pBVar17 < pBVar13) goto LAB_006f80ee;
                  if (sStack_88 == 0) goto LAB_006f810d;
                  if (sVar7 < 0x10) {
                    if (pBVar23 < pBVar17) goto LAB_006f8375;
                    if (sVar7 < 8) {
                      iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar7 * 4);
                      *pBVar23 = *pBVar17;
                      pBVar23[1] = pBVar17[1];
                      pBVar23[2] = pBVar17[2];
                      pBVar23[3] = pBVar17[3];
                      pBVar13 = pBVar17 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar7 * 4);
                      pBVar17 = pBVar17 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar7 * 4
                                                           ) - (long)iVar18);
                      *(undefined4 *)(pBVar23 + 4) = *(undefined4 *)pBVar13;
                    }
                    else {
                      *(undefined8 *)pBVar23 = *(undefined8 *)pBVar17;
                    }
                    pBVar13 = pBVar17 + 8;
                    pBVar15 = pBVar23 + 8;
                    if ((long)pBVar15 - (long)pBVar13 < 8) goto LAB_006f8394;
                    if (8 < sStack_88) {
                      if (pBVar16 <= pBVar15) goto LAB_006f83b3;
                      if ((ulong)((long)pBVar15 - (long)pBVar13) < 0x10) {
                        do {
                          *(undefined8 *)pBVar15 = *(undefined8 *)pBVar13;
                          pBVar15 = pBVar15 + 8;
                          pBVar13 = pBVar13 + 8;
                        } while (pBVar15 < pBVar23 + sStack_88);
                      }
                      else {
                        uVar6 = *(undefined8 *)(pBVar17 + 0x10);
                        *(undefined8 *)pBVar15 = *(undefined8 *)pBVar13;
                        *(undefined8 *)(pBVar23 + 0x10) = uVar6;
                        if (0x18 < (long)sStack_88) {
                          lVar9 = 0;
                          do {
                            uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x18 + 8);
                            pBVar16 = pBVar23 + lVar9 + 0x18;
                            *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar17 + lVar9 + 0x18);
                            *(undefined8 *)(pBVar16 + 8) = uVar6;
                            uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x28 + 8);
                            *(undefined8 *)(pBVar16 + 0x10) =
                                 *(undefined8 *)(pBVar17 + lVar9 + 0x28);
                            *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar16 + 0x20 < pBVar23 + sStack_88);
                        }
                      }
                    }
                  }
                  else {
                    if ((BYTE *)0xffffffffffffffe0 < pBVar23 + (-0x10 - (long)pBVar17))
                    goto LAB_006f80b0;
                    uVar6 = *(undefined8 *)(pBVar17 + 8);
                    *(undefined8 *)pBVar23 = *(undefined8 *)pBVar17;
                    *(undefined8 *)(pBVar23 + 8) = uVar6;
                    if (0x10 < (long)sStack_88) {
                      lVar9 = 0x10;
                      do {
                        uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 8);
                        pBVar16 = pBVar23 + lVar9;
                        *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar17 + lVar9);
                        *(undefined8 *)(pBVar16 + 8) = uVar6;
                        uVar6 = *(undefined8 *)(pBVar17 + lVar9 + 0x10 + 8);
                        *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(pBVar17 + lVar9 + 0x10);
                        *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                        lVar9 = lVar9 + 0x20;
                      } while (pBVar16 + 0x20 < pBVar23 + sStack_88);
                    }
                  }
                }
              }
              if (0xffffffffffffff88 < sVar19) {
                return sVar19;
              }
              dst = (void *)((long)dst + sVar19);
              local_74 = local_74 + -1;
              if (local_74 == 0) break;
              if (local_128.bitsConsumed < 0x41) {
                if (local_128.ptr < local_128.limitPtr) {
                  if (local_128.ptr == local_128.start) goto LAB_006f7758;
                  uVar14 = (int)local_128.ptr - (int)local_128.start;
                  if (local_128.start <=
                      (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                    uVar14 = local_128.bitsConsumed >> 3;
                  }
                  local_128.bitsConsumed = local_128.bitsConsumed + uVar14 * -8;
                }
                else {
                  uVar14 = local_128.bitsConsumed >> 3;
                  local_128.bitsConsumed = local_128.bitsConsumed & 7;
                }
                local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar14);
                local_128.bitContainer = *(size_t *)local_128.ptr;
              }
            } while( true );
          }
LAB_006f7e32:
          if (local_128.bitsConsumed < 0x41) {
            if (local_128.ptr < local_128.limitPtr) {
              if (local_128.bitsConsumed != 0x40) goto LAB_006f7e93;
              if (local_128.ptr != local_128.start) {
                return 0xffffffffffffffec;
              }
            }
            else {
              BVar8 = BIT_reloadDStreamFast(&local_128);
              if (BVar8 < BIT_DStream_completed) {
                return 0xffffffffffffffec;
              }
            }
          }
          lVar9 = 0;
          do {
            (local_70->entropy).rep[lVar9] = (U32)local_d0[lVar9];
            lVar9 = lVar9 + 1;
            pBVar17 = local_40;
            dctx = local_70;
          } while (lVar9 != 3);
          goto LAB_006f68cc;
        }
      }
      else {
        local_128.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_128.bitContainer = *(size_t *)local_128.ptr;
        if (local_128.bitContainer >> 0x38 != 0) {
          uVar14 = 0x1f;
          bVar1 = (byte)(local_128.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          local_128.bitsConsumed = ~uVar14 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_006f69af;
        }
      }
    }
LAB_006f7e93:
    sVar20 = 0xffffffffffffffec;
  }
  return sVar20;
}

Assistant:

static size_t
ZSTD_decompressSequencesSplitLitBuffer(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                                 const void* seqStart, size_t seqSize, int nbSeq,
                                 const ZSTD_longOffset_e isLongOffset,
                                 const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesSplitLitBuffer");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesSplitLitBuffer_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequencesSplitLitBuffer_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}